

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.c
# Opt level: O2

rt_function_error_t exec_celu(rt_function_t *f)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  plVar1 = (long *)f->local_context;
  plVar2 = (long *)*plVar1;
  uVar9 = 1;
  for (lVar4 = (long)*(int *)((long)plVar1 + 0xc); lVar4 < (int)plVar2[6]; lVar4 = lVar4 + 1) {
    uVar9 = uVar9 * *(int *)(plVar2[7] + lVar4 * 4);
  }
  uVar6 = (long)(int)plVar2[2] / (long)(int)uVar9;
  uVar8 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar8;
  }
  uVar5 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar5 = uVar8;
  }
  lVar4 = (long)(int)uVar9 * 4;
  lVar13 = 0;
  for (uVar6 = 0; uVar7 = uVar8, uVar11 = uVar10, lVar12 = lVar13, uVar6 != uVar5; uVar6 = uVar6 + 1
      ) {
    while (uVar11 != 0) {
      fVar16 = *(float *)(*(long *)(*plVar2 + 0x18) + uVar7);
      lVar3 = *(long *)(plVar2[3] + 0x18);
      fVar15 = fVar16;
      if (fVar16 <= 0.0) {
        fVar15 = *(float *)(plVar1 + 1);
        fVar14 = expf(fVar16);
        fVar15 = (fVar14 + -1.0) * fVar15;
      }
      *(float *)(lVar3 + lVar12) = fVar15;
      if (0.0 <= fVar16) {
        fVar15 = *(float *)(plVar1 + 1);
        fVar16 = expf(-fVar16);
        fVar16 = (fVar16 + -1.0) * fVar15;
      }
      else {
        fVar16 = -fVar16;
      }
      *(float *)(lVar12 + lVar3 + lVar4) = fVar16;
      uVar7 = uVar7 + 4;
      uVar11 = uVar11 - 1;
      lVar12 = lVar12 + 4;
    }
    lVar13 = lVar13 + (long)(int)uVar9 * 8;
    uVar8 = uVar8 + lVar4;
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_celu(rt_function_t *f) {
  celu_local_context_t *c = (celu_local_context_t *)(f->local_context);
  celu_private_t *p = (celu_private_t *)(c->data);
  int i, j, s0 = 1, s1;

  for (i = c->axis; i < p->in_shape.size; ++i) {
    s0 *= p->in_shape.data[i];
  }
  s1 = p->input_size / s0;

  for (i = 0; i < s1; ++i) {
    for (j = 0; j < s0; ++j) {
      float x = *((float *)(p->input->data) + i * s0 + j);
      float *y = (float *)(p->output->data);
      *(y + i * s0 * 2 + j) = x > 0.0f ? x : c->alpha * (expf(x) - 1.0f);
      *(y + i * s0 * 2 + s0 + j) = x < 0.0f ? -x : c->alpha * (expf(-x) - 1.0f);
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}